

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxp.c
# Opt level: O3

void duckdb_je_fxp_print(fxp_t a,char *buf)

{
  int i;
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  size_t __n;
  ulong uVar4;
  
  uVar3 = (ulong)a & 0xffff;
  uVar1 = 0;
  __n = 0;
  do {
    if (uVar3 - 0x199a < 0xe666) {
      __n = (size_t)uVar1;
    }
    uVar3 = uVar3 * 10;
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0xe);
  uVar4 = uVar3 >> 0x10;
  if ((0xffff < uVar3) && (uVar3 = uVar4, uVar4 == (uVar4 / 10) * 10)) {
    do {
      uVar4 = uVar3 / 10;
      if (uVar3 < 10) break;
      uVar3 = uVar4;
    } while (uVar4 == (uVar4 / 10) * 10);
  }
  sVar2 = duckdb_je_malloc_snprintf(buf,0x15,"%u.",a >> 0x10);
  if (0 < (int)__n) {
    switchD_012e3010::default(buf + sVar2,0x30,__n);
    sVar2 = sVar2 + ((int)__n - 1) + 1;
  }
  duckdb_je_malloc_snprintf(buf + sVar2,0x15 - sVar2,"%lu",uVar4);
  return;
}

Assistant:

void
fxp_print(fxp_t a, char buf[FXP_BUF_SIZE]) {
	uint32_t integer_part = fxp_round_down(a);
	uint32_t fractional_part = (a & ((1U << 16) - 1));

	int leading_fraction_zeros = 0;
	uint64_t fraction_digits = fractional_part;
	for (int i = 0; i < FXP_FRACTIONAL_PART_DIGITS; i++) {
		if (fraction_digits < (1U << 16)
		    && fraction_digits * 10 >= (1U << 16)) {
			leading_fraction_zeros = i;
		}
		fraction_digits *= 10;
	}
	fraction_digits >>= 16;
	while (fraction_digits > 0 && fraction_digits % 10 == 0) {
		fraction_digits /= 10;
	}

	size_t printed = malloc_snprintf(buf, FXP_BUF_SIZE, "%"FMTu32".",
	    integer_part);
	for (int i = 0; i < leading_fraction_zeros; i++) {
		buf[printed] = '0';
		printed++;
	}
	malloc_snprintf(&buf[printed], FXP_BUF_SIZE - printed, "%"FMTu64,
	    fraction_digits);
}